

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::setupFactorTime(HighsSimplexAnalysis *this,HighsOptions *options)

{
  bool bVar1;
  HighsTimerClock *pHVar2;
  long in_RSI;
  __normal_iterator<HighsTimerClock_*,_std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>_>
  *in_RDI;
  HighsTimerClock *clock_1;
  iterator __end2;
  iterator __begin2;
  vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *__range2;
  FactorTimer factor_timer;
  HighsTimerClock *in_stack_00000038;
  HighsTimerClock clock;
  HighsInt i;
  HighsInt max_threads;
  vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *in_stack_ffffffffffffff88;
  value_type *in_stack_ffffffffffffff98;
  vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<HighsTimerClock_*,_std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>_>
  local_58;
  __normal_iterator<HighsTimerClock_*,_std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>_>
  *local_50;
  vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> local_38;
  int local_18;
  int local_14;
  
  *(bool *)((long)&in_RDI[0x1e]._M_current + 5) = (*(uint *)(in_RSI + 0x160) & 0x20) != 0;
  if (((ulong)in_RDI[0x1e]._M_current & 0x10000000000) == 0) {
    in_RDI[7]._M_current = (HighsTimerClock *)0x0;
  }
  else {
    local_14 = ::highs::parallel::num_threads();
    std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::clear
              ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)0x7b2e59);
    for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
      in_stack_ffffffffffffff88 = &local_38;
      HighsTimerClock::HighsTimerClock((HighsTimerClock *)0x7b2e79);
      local_38.super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
      super__Vector_impl_data._M_start = in_RDI->_M_current;
      std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::push_back
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      HighsTimerClock::~HighsTimerClock((HighsTimerClock *)0x7b2e9f);
    }
    pHVar2 = std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::data
                       ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)0x7b2ed7);
    in_RDI[7]._M_current = pHVar2;
    local_50 = in_RDI + 4;
    local_58._M_current =
         (HighsTimerClock *)
         std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::begin
                   (in_stack_ffffffffffffff88);
    std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::end(in_stack_ffffffffffffff88);
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<HighsTimerClock_*,_std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>_>
                                      *)in_stack_ffffffffffffff88), bVar1) {
      __gnu_cxx::
      __normal_iterator<HighsTimerClock_*,_std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>_>
      ::operator*(&local_58);
      FactorTimer::initialiseFactorClocks((FactorTimer *)clock.timer_pointer_,in_stack_00000038);
      __gnu_cxx::
      __normal_iterator<HighsTimerClock_*,_std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>_>
      ::operator++(&local_58);
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::setupFactorTime(const HighsOptions& options) {
  analyse_factor_time =
      kHighsAnalysisLevelNlaTime & options.highs_analysis_level;
  if (analyse_factor_time) {
    // Set up the thread clocks
    HighsInt max_threads = highs::parallel::num_threads();
    thread_factor_clocks.clear();
    for (HighsInt i = 0; i < max_threads; i++) {
      HighsTimerClock clock;
      clock.timer_pointer_ = timer_;
      thread_factor_clocks.push_back(clock);
    }
    pointer_serial_factor_clocks = thread_factor_clocks.data();
    FactorTimer factor_timer;
    for (HighsTimerClock& clock : thread_factor_clocks)
      factor_timer.initialiseFactorClocks(clock);
  } else {
    pointer_serial_factor_clocks = NULL;
  }
}